

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

void av1_scale_references(AV1_COMP *cpi,InterpFilter filter,int phase,int use_optimized_scaler)

{
  YV12_BUFFER_CONFIG *ybf;
  YV12_BUFFER_CONFIG *ybf_00;
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  RefCntBuffer *pRVar5;
  BufferPool *pBVar6;
  AV1_PRIMARY *pAVar7;
  RefCntBuffer *pRVar8;
  int *piVar9;
  SequenceHeader *pSVar10;
  _Bool _Var11;
  int num_planes;
  int iVar12;
  long lVar13;
  MV_REF *pMVar14;
  uint8_t *puVar15;
  TPL_MV_REF *pTVar16;
  uint uVar17;
  int iVar18;
  int *piVar19;
  long lVar20;
  pthread_mutex_t *ppVar21;
  ulong uVar22;
  RefCntBuffer *pRVar23;
  RefCntBuffer *buf;
  bool bVar24;
  bool bVar25;
  
  uVar1 = ((cpi->common).seq_params)->monochrome;
  num_planes = (uint)(uVar1 == '\0') * 2 + 1;
  lVar20 = 1;
  do {
    if ((cpi->ref_frame_flags & (uint)""[lVar20]) == 0) {
      if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) goto LAB_001c8eba;
LAB_001c8eae:
      cpi->scaled_ref_buf[lVar20 + -1] = (RefCntBuffer *)0x0;
    }
    else {
      lVar13 = (long)(cpi->common).remapped_ref_idx[(uint)lVar20 - 1];
      if (lVar13 == -1) goto LAB_001c8eae;
      pRVar5 = (cpi->common).ref_frame_map[lVar13];
      ybf = &pRVar5->buf;
      if (pRVar5 == (RefCntBuffer *)0x0) goto LAB_001c8eae;
      pBVar6 = (cpi->common).buffer_pool;
      pAVar7 = cpi->ppi;
      if (((pAVar7->use_svc != 0) && ((cpi->svc).force_zero_mode_spatial_ref != 0)) &&
         ((pAVar7->rtc_ref).set_ref_frame_config != 0)) {
        if ((char)lVar20 == '\a') {
          iVar12 = (cpi->svc).skip_mvsearch_altref;
        }
        else {
          uVar17 = (uint)lVar20 & 0xff;
          if (uVar17 == 4) {
            iVar12 = (cpi->svc).skip_mvsearch_gf;
          }
          else {
            if (uVar17 != 1) goto LAB_001c8ee2;
            iVar12 = (cpi->svc).skip_mvsearch_last;
          }
        }
        if (iVar12 != 0) goto LAB_001c8eba;
      }
LAB_001c8ee2:
      if ((((((cpi->oxcf).pass != AOM_RC_ONE_PASS) || (pAVar7->lap_enabled != 0)) ||
           (((cpi->oxcf).mode != '\x01' ||
            (((cpi->oxcf).gf_cfg.lag_in_frames != 0 || (lVar20 != 4)))))) ||
          ((cpi->oxcf).superres_cfg.enable_superres == false)) ||
         ((int)((cpi->common).current_frame.frame_number - 1) <= (cpi->rc).frame_num_last_gf_refresh
         )) {
        iVar12 = (pRVar5->buf).field_2.field_0.y_crop_width;
        iVar18 = (cpi->common).width;
        if ((iVar12 == iVar18) &&
           ((pRVar5->buf).field_3.field_0.y_crop_height == (cpi->common).height)) {
          cpi->scaled_ref_buf[lVar20 + -1] = pRVar5;
          pRVar5->ref_count = pRVar5->ref_count + 1;
        }
        else {
          if (((iVar18 < iVar12) ||
              ((cpi->common).height < (pRVar5->buf).field_3.field_0.y_crop_height)) &&
             (((pRVar5->buf).border < 0x120 &&
              (iVar12 = aom_yv12_realloc_with_new_border_c
                                  (ybf,0x120,(cpi->common).features.byte_alignment,
                                   cpi->alloc_pyramid,num_planes), iVar12 != 0)))) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
          pRVar8 = cpi->scaled_ref_buf[lVar20 + -1];
          if (pRVar8 == (RefCntBuffer *)0x0) {
            ppVar21 = (pthread_mutex_t *)(cpi->common).buffer_pool;
            piVar9 = *(int **)((long)ppVar21 + 0x40);
            pthread_mutex_lock(ppVar21);
            ppVar21 = (pthread_mutex_t *)(cpi->common).buffer_pool;
            bVar2 = *(byte *)((long)ppVar21 + 0x48);
            if (bVar2 == 0) {
              uVar22 = 0;
LAB_001c903e:
              uVar17 = (uint)uVar22;
              if (uVar17 == bVar2) goto LAB_001c9043;
              piVar19 = piVar9 + (uVar22 & 0xffffffff) * 0x1638;
              if (piVar9[(uVar22 & 0xffffffff) * 0x1638 + 0x148] != 0) {
                *(undefined8 *)(piVar19 + 0x142) = *(undefined8 *)(piVar19 + 0x14a);
                *(undefined8 *)(piVar19 + 0x144) = *(undefined8 *)(piVar19 + 0x14c);
                *(undefined8 *)(piVar19 + 0x146) = *(undefined8 *)(piVar19 + 0x14e);
                piVar19[0x148] = 0;
                ppVar21 = (pthread_mutex_t *)(cpi->common).buffer_pool;
              }
              *piVar19 = 1;
              pthread_mutex_unlock(ppVar21);
              if (uVar17 == 0xffffffff) goto LAB_001c9048;
            }
            else {
              uVar22 = 0;
              piVar19 = piVar9;
              do {
                if (*piVar19 == 0) goto LAB_001c903e;
                uVar22 = uVar22 + 1;
                piVar19 = piVar19 + 0x1638;
              } while ((uint)bVar2 != uVar22);
LAB_001c9043:
              pthread_mutex_unlock(ppVar21);
LAB_001c9048:
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Unable to find free frame buffer");
              uVar17 = 0xffffffff;
            }
            iVar18 = (cpi->common).height;
            pRVar23 = pBVar6->frame_bufs + (int)uVar17;
            iVar12 = (cpi->common).width;
          }
          else {
            iVar3 = (pRVar8->buf).field_2.field_0.y_crop_width;
            iVar12 = (cpi->common).width;
            iVar18 = (cpi->common).height;
            pRVar23 = pRVar8;
            if ((iVar3 == iVar12) &&
               (iVar12 = iVar3, (pRVar8->buf).field_3.field_0.y_crop_height == iVar18))
            goto LAB_001c8eba;
          }
          ybf_00 = &pRVar23->buf;
          pSVar10 = (cpi->common).seq_params;
          iVar12 = aom_realloc_frame_buffer
                             (ybf_00,iVar12,iVar18,pSVar10->subsampling_x,pSVar10->subsampling_y,
                              (uint)pSVar10->use_highbitdepth,0x120,
                              (cpi->common).features.byte_alignment,(aom_codec_frame_buffer_t *)0x0,
                              (aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,false,0);
          if (iVar12 != 0) {
            if (pRVar8 == (RefCntBuffer *)0x0) {
              pRVar23->ref_count = pRVar23->ref_count + -1;
            }
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
          iVar12 = (pRVar5->buf).field_2.field_0.y_crop_width;
          iVar18 = (pRVar5->buf).field_3.field_0.y_crop_height;
          iVar3 = (pRVar23->buf).field_2.field_0.y_crop_width;
          iVar4 = (pRVar23->buf).field_3.field_0.y_crop_height;
          if ((((((iVar3 * 4 < iVar12) || (iVar4 * 4 < iVar18)) || (iVar12 * 0x10 < iVar3)) ||
               ((iVar18 * 0x10 < iVar4 || ((iVar3 << 4) % iVar12 != 0)))) ||
              ((iVar12 * 0x10) % iVar3 != 0)) ||
             (((iVar4 << 4) % iVar18 != 0 || ((iVar18 * 0x10) % iVar4 != 0)))) {
            if (iVar3 * 4 + iVar12 * -3 == 0) {
              bVar24 = iVar4 * 4 == iVar18 * 3;
              goto LAB_001c91f0;
            }
LAB_001c92d8:
            _Var11 = av1_resize_and_extend_frame_nonnormative
                               (ybf,ybf_00,((cpi->common).seq_params)->bit_depth,num_planes);
            if (!_Var11) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate buffer during resize");
            }
          }
          else {
            bVar24 = true;
LAB_001c91f0:
            bVar25 = (bool)(uVar1 != '\0' & bVar24);
            if ((uVar1 == '\0') && (bVar24)) {
              iVar12 = (pRVar5->buf).field_2.field_0.uv_crop_width;
              iVar18 = (pRVar5->buf).field_3.field_0.uv_crop_height;
              iVar3 = (pRVar23->buf).field_2.field_0.uv_crop_width;
              iVar4 = (pRVar23->buf).field_3.field_0.uv_crop_height;
              if ((((iVar3 * 4 < iVar12) ||
                   (((iVar4 * 4 < iVar18 || (iVar12 * 0x10 < iVar3)) || (iVar18 * 0x10 < iVar4))))
                  || ((((iVar3 << 4) % iVar12 != 0 || ((iVar12 * 0x10) % iVar3 != 0)) ||
                      ((iVar4 << 4) % iVar18 != 0)))) || ((iVar18 * 0x10) % iVar4 != 0)) {
                if (iVar3 * 4 + iVar12 * -3 != 0) goto LAB_001c92d8;
                bVar25 = iVar4 * 4 == iVar18 * 3;
              }
              else {
                bVar25 = true;
              }
            }
            if (((use_optimized_scaler == 0) || (!bVar25)) ||
               (((cpi->common).seq_params)->bit_depth != AOM_BITS_8)) goto LAB_001c92d8;
            (*av1_resize_and_extend_frame)(ybf,ybf_00,filter,phase,num_planes);
          }
          cpi->scaled_ref_buf[lVar20 + -1] = pRVar23;
          if (((pRVar23->mvs == (MV_REF *)0x0) ||
              (pRVar23->mi_rows != (cpi->common).mi_params.mi_rows)) ||
             (pRVar23->mi_cols != (cpi->common).mi_params.mi_cols)) {
            aom_free(pRVar23->mvs);
            iVar12 = (cpi->common).mi_params.mi_rows;
            pRVar23->mi_rows = iVar12;
            iVar18 = (cpi->common).mi_params.mi_cols;
            pRVar23->mi_cols = iVar18;
            pMVar14 = (MV_REF *)aom_calloc((long)((iVar18 + 1 >> 1) * (iVar12 + 1 >> 1)),8);
            pRVar23->mvs = pMVar14;
            if (pMVar14 == (MV_REF *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate buf->mvs");
            }
            aom_free(pRVar23->seg_map);
            puVar15 = (uint8_t *)
                      aom_calloc((long)(cpi->common).mi_params.mi_cols *
                                 (long)(cpi->common).mi_params.mi_rows,1);
            pRVar23->seg_map = puVar15;
            if (puVar15 == (uint8_t *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate buf->seg_map");
            }
          }
          iVar12 = ((cpi->common).mi_params.mi_stride >> 1) *
                   ((cpi->common).mi_params.mi_rows + 0x20 >> 1);
          pTVar16 = (cpi->common).tpl_mvs;
          if ((pTVar16 == (TPL_MV_REF *)0x0) || ((cpi->common).tpl_mvs_mem_size < iVar12)) {
            aom_free(pTVar16);
            pTVar16 = (TPL_MV_REF *)aom_calloc((long)iVar12,8);
            (cpi->common).tpl_mvs = pTVar16;
            if (pTVar16 == (TPL_MV_REF *)0x0) {
              aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate cm->tpl_mvs");
            }
            (cpi->common).tpl_mvs_mem_size = iVar12;
          }
          iVar12 = (cpi->common).height;
          pRVar23->width = (cpi->common).width;
          pRVar23->height = iVar12;
        }
      }
    }
LAB_001c8eba:
    lVar20 = lVar20 + 1;
    if (lVar20 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void av1_scale_references(AV1_COMP *cpi, const InterpFilter filter,
                          const int phase, const int use_optimized_scaler) {
  AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MV_REFERENCE_FRAME ref_frame;

  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    // Need to convert from AOM_REFFRAME to index into ref_mask (subtract 1).
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref_frame]) {
      BufferPool *const pool = cm->buffer_pool;
      const YV12_BUFFER_CONFIG *const ref =
          get_ref_frame_yv12_buf(cm, ref_frame);

      if (ref == NULL) {
        cpi->scaled_ref_buf[ref_frame - 1] = NULL;
        continue;
      }

      // For RTC-SVC: if force_zero_mode_spatial_ref is enabled, check if the
      // motion search can be skipped for the references: last, golden, altref.
      // If so, we can skip scaling that reference.
      if (cpi->ppi->use_svc && cpi->svc.force_zero_mode_spatial_ref &&
          cpi->ppi->rtc_ref.set_ref_frame_config) {
        if (ref_frame == LAST_FRAME && cpi->svc.skip_mvsearch_last) continue;
        if (ref_frame == GOLDEN_FRAME && cpi->svc.skip_mvsearch_gf) continue;
        if (ref_frame == ALTREF_FRAME && cpi->svc.skip_mvsearch_altref)
          continue;
      }
      // For RTC with superres on: golden reference only needs to be scaled
      // if it was refreshed in previous frame.
      if (is_one_pass_rt_params(cpi) &&
          cpi->oxcf.superres_cfg.enable_superres && ref_frame == GOLDEN_FRAME &&
          cpi->rc.frame_num_last_gf_refresh <
              (int)cm->current_frame.frame_number - 1) {
        continue;
      }

      if (ref->y_crop_width != cm->width || ref->y_crop_height != cm->height) {
        // Replace the reference buffer with a copy having a thicker border,
        // if the reference buffer is higher resolution than the current
        // frame, and the border is thin.
        if ((ref->y_crop_width > cm->width ||
             ref->y_crop_height > cm->height) &&
            ref->border < AOM_BORDER_IN_PIXELS) {
          RefCntBuffer *ref_fb = get_ref_frame_buf(cm, ref_frame);
          if (aom_yv12_realloc_with_new_border(
                  &ref_fb->buf, AOM_BORDER_IN_PIXELS,
                  cm->features.byte_alignment, cpi->alloc_pyramid,
                  num_planes) != 0) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
        }
        int force_scaling = 0;
        RefCntBuffer *new_fb = cpi->scaled_ref_buf[ref_frame - 1];
        if (new_fb == NULL) {
          const int new_fb_idx = get_free_fb(cm);
          if (new_fb_idx == INVALID_IDX) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Unable to find free frame buffer");
          }
          force_scaling = 1;
          new_fb = &pool->frame_bufs[new_fb_idx];
        }

        if (force_scaling || new_fb->buf.y_crop_width != cm->width ||
            new_fb->buf.y_crop_height != cm->height) {
          if (aom_realloc_frame_buffer(
                  &new_fb->buf, cm->width, cm->height,
                  cm->seq_params->subsampling_x, cm->seq_params->subsampling_y,
                  cm->seq_params->use_highbitdepth, AOM_BORDER_IN_PIXELS,
                  cm->features.byte_alignment, NULL, NULL, NULL, false, 0)) {
            if (force_scaling) {
              // Release the reference acquired in the get_free_fb() call above.
              --new_fb->ref_count;
            }
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate frame buffer");
          }
          bool has_optimized_scaler = av1_has_optimized_scaler(
              ref->y_crop_width, ref->y_crop_height, new_fb->buf.y_crop_width,
              new_fb->buf.y_crop_height);
          if (num_planes > 1) {
            has_optimized_scaler =
                has_optimized_scaler &&
                av1_has_optimized_scaler(
                    ref->uv_crop_width, ref->uv_crop_height,
                    new_fb->buf.uv_crop_width, new_fb->buf.uv_crop_height);
          }
#if CONFIG_AV1_HIGHBITDEPTH
          if (use_optimized_scaler && has_optimized_scaler &&
              cm->seq_params->bit_depth == AOM_BITS_8) {
            av1_resize_and_extend_frame(ref, &new_fb->buf, filter, phase,
                                        num_planes);
          } else if (!av1_resize_and_extend_frame_nonnormative(
                         ref, &new_fb->buf, (int)cm->seq_params->bit_depth,
                         num_planes)) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate buffer during resize");
          }
#else
          if (use_optimized_scaler && has_optimized_scaler) {
            av1_resize_and_extend_frame(ref, &new_fb->buf, filter, phase,
                                        num_planes);
          } else if (!av1_resize_and_extend_frame_nonnormative(
                         ref, &new_fb->buf, (int)cm->seq_params->bit_depth,
                         num_planes)) {
            aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate buffer during resize");
          }
#endif
          cpi->scaled_ref_buf[ref_frame - 1] = new_fb;
          alloc_frame_mvs(cm, new_fb);
        }
      } else {
        RefCntBuffer *buf = get_ref_frame_buf(cm, ref_frame);
        buf->buf.y_crop_width = ref->y_crop_width;
        buf->buf.y_crop_height = ref->y_crop_height;
        cpi->scaled_ref_buf[ref_frame - 1] = buf;
        ++buf->ref_count;
      }
    } else {
      if (!has_no_stats_stage(cpi)) cpi->scaled_ref_buf[ref_frame - 1] = NULL;
    }
  }
}